

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait.c
# Opt level: O2

int nsync_mu_wait_with_deadline
              (nsync_mu *mu,_func_int_void_ptr *condition,void *condition_arg,
              _func_int_void_ptr_void_ptr *condition_arg_eq,nsync_time abs_deadline,
              nsync_note cancel_note)

{
  nsync_dll_element_ *pnVar1;
  nsync_atomic_uint32_ nVar2;
  nsync_atomic_uint32_ nVar3;
  lock_type *l_type;
  uint32_t set;
  int iVar4;
  uint32_t uVar5;
  uint uVar6;
  lock_type **pplVar7;
  waiter *w;
  nsync_dll_element_ *pnVar8;
  nsync_dll_list_ pnVar9;
  uint32_t uVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  bool bVar14;
  uint local_6c;
  
  uVar6 = mu->word;
  if ((uVar6 & 0xffffff01) == 0) {
    nsync_panic_("nsync_mu not held in some mode when calling nsync_mu_wait_with_deadline()\n");
  }
  if (uVar6 < 0x100) {
    pplVar7 = &nsync_writer_type_;
  }
  else {
    pplVar7 = &nsync_reader_type_;
  }
  l_type = *pplVar7;
  bVar14 = true;
  if (condition == (_func_int_void_ptr *)0x0) {
    set = 6;
  }
  else {
    iVar4 = (*condition)(condition_arg);
    bVar14 = iVar4 != 0;
    set = 0x16;
  }
  w = (waiter *)0x0;
  iVar4 = 0;
  bVar11 = false;
  do {
    if (iVar4 != 0 || bVar14) {
      if (w != (waiter *)0x0) {
        nsync_waiter_free_(w);
      }
      iVar13 = 0;
      if (!bVar14) {
        iVar13 = iVar4;
      }
      return iVar13;
    }
    if (w == (waiter *)0x0) {
      w = nsync_waiter_new_();
    }
    w->cv_mu = (nsync_mu_s_ *)0x0;
    w->l_type = l_type;
    (w->cond).f = condition;
    (w->cond).v = condition_arg;
    (w->cond).eq = condition_arg_eq;
    (w->nw).waiting = 1;
    nVar2 = w->remove_count;
    uVar5 = nsync_spin_test_and_set_(&mu->word,2,set,0x80);
    if (bVar11) {
      pnVar1 = &(w->nw).q;
      pnVar8 = nsync_dll_first_(mu->waiters);
      nsync_maybe_merge_conditions_(pnVar1,pnVar8);
      pnVar9 = nsync_dll_make_first_in_list_(mu->waiters,pnVar1);
    }
    else {
      pnVar8 = nsync_dll_last_(mu->waiters);
      pnVar1 = &(w->nw).q;
      nsync_maybe_merge_conditions_(pnVar8,pnVar1);
      pnVar9 = nsync_dll_make_last_in_list_(mu->waiters,pnVar1);
    }
    mu->waiters = pnVar9;
    do {
      nVar3 = mu->word;
      uVar10 = 0;
      if ((nVar3 - l_type->add_to_acquire & 0xffffff01) != 0 || (uVar5 & 0xc) != 4) {
        uVar10 = l_type->add_to_acquire;
      }
      LOCK();
      bVar14 = nVar3 == mu->word;
      if (bVar14) {
        mu->word = nVar3 - uVar10 & 0xfffffffd;
      }
      UNLOCK();
    } while (!bVar14);
    if (uVar10 == 0) {
      nsync_mu_unlock_slow_(mu,l_type);
    }
    iVar4 = 0;
    iVar13 = 0;
    local_6c = 0;
    bVar14 = false;
LAB_001078e3:
    if ((w->nw).waiting != 0) {
      if (iVar13 == 0) {
        iVar13 = nsync_sem_wait_with_cancel_(w,abs_deadline,cancel_note);
        if (iVar13 == 0) {
          iVar13 = 0;
        }
        else if ((w->nw).waiting != 0) {
          uVar6 = 0;
          do {
            uVar12 = mu->word;
            if ((uVar12 & 0xffffff43) == 0) {
              LOCK();
              bVar14 = uVar12 == mu->word;
              if (bVar14) {
                mu->word = uVar12 & 0x9c | 3;
              }
              UNLOCK();
              if (bVar14) goto LAB_0010796e;
            }
            if ((uVar12 & 0x22) == 0) {
              LOCK();
              if (uVar12 == mu->word) {
                mu->word = uVar12 | 0x20;
              }
              UNLOCK();
            }
            uVar6 = nsync_spin_delay_(uVar6);
          } while( true );
        }
      }
      goto LAB_001079d8;
    }
    if (!bVar14) {
      nsync_mu_lock_slow_(mu,w,8,l_type);
    }
    bVar11 = true;
    bVar14 = true;
    if (condition != (_func_int_void_ptr *)0x0) {
      iVar13 = (*condition)(condition_arg);
      bVar14 = iVar13 != 0;
    }
  } while( true );
LAB_0010796e:
  if (((w->nw).waiting == 0) || (w->remove_count != nVar2)) {
    bVar14 = false;
  }
  else {
    pnVar9 = nsync_remove_from_mu_queue_(mu->waiters,&(w->nw).q);
    mu->waiters = pnVar9;
    (w->nw).waiting = 0;
    uVar12 = uVar12 + l_type->add_to_acquire;
    bVar14 = true;
    iVar4 = iVar13;
  }
  mu->word = uVar12;
LAB_001079d8:
  if ((w->nw).waiting != 0) {
    local_6c = nsync_spin_delay_(local_6c);
  }
  goto LAB_001078e3;
}

Assistant:

int nsync_mu_wait_with_deadline (nsync_mu *mu,
				 int (*condition) (const void *condition_arg),
				 const void *condition_arg,
				 int (*condition_arg_eq) (const void *a, const void *b),
				 nsync_time abs_deadline, nsync_note cancel_note) {
	lock_type *l_type;
	int first_wait;
	int condition_is_true;
	waiter *w;
	int outcome;
	/* Work out in which mode the lock is held. */
	uint32_t old_word;
	IGNORE_RACES_START ();
	old_word = ATM_LOAD (&mu->word);
	if ((old_word & MU_ANY_LOCK) == 0) {
		nsync_panic_ ("nsync_mu not held in some mode when calling "
		       "nsync_mu_wait_with_deadline()\n");
	}
	l_type = nsync_writer_type_;
	if ((old_word & MU_RHELD_IF_NON_ZERO) != 0) {
		l_type = nsync_reader_type_;
	}

	first_wait = 1; /* first time through the loop below. */
	condition_is_true = (condition == NULL || (*condition) (condition_arg));

	/* Loop until either the condition becomes true, or "outcome" indicates
	   cancellation or timeout. */
	w = NULL;
	outcome = 0;
	while (outcome == 0 && !condition_is_true) {
		uint32_t has_condition;
		uint32_t remove_count;
		uint32_t add_to_acquire;
		int had_waiters;
		int sem_outcome;
		unsigned attempts;
		int have_lock;
		if (w == NULL) {
			w = nsync_waiter_new_ (); /* get a waiter struct if we need one. */
		}

		/* Prepare to wait. */
		w->cv_mu = NULL; /* not a condition variable wait */
		w->l_type = l_type;
		w->cond.f = condition;
		w->cond.v = condition_arg;
		w->cond.eq = condition_arg_eq;
		has_condition = 0; /* set to MU_CONDITION if condition is non-NULL */
		if (condition != NULL) {
			has_condition = MU_CONDITION;
		}
		ATM_STORE (&w->nw.waiting, 1);
		remove_count = ATM_LOAD (&w->remove_count);

		/* Acquire spinlock. */
		old_word = nsync_spin_test_and_set_ (&mu->word, MU_SPINLOCK,
			MU_SPINLOCK|MU_WAITING|has_condition, MU_ALL_FALSE);
		had_waiters = ((old_word & (MU_DESIG_WAKER | MU_WAITING)) == MU_WAITING);
		/* Queue the waiter. */
		if (first_wait) {
			nsync_maybe_merge_conditions_ (nsync_dll_last_ (mu->waiters),
						       &w->nw.q);
			/* first wait goes to end of queue */
			mu->waiters = nsync_dll_make_last_in_list_ (mu->waiters,
							            &w->nw.q);
			first_wait = 0;
		} else {
			nsync_maybe_merge_conditions_ (&w->nw.q,
						       nsync_dll_first_ (mu->waiters));
			/* subsequent waits go to front of queue */
			mu->waiters = nsync_dll_make_first_in_list_ (mu->waiters,
							             &w->nw.q);
		}
		/* Release spinlock and *mu. */
		RWLOCK_RELEASE (mu, l_type == nsync_writer_type_);
		do {
			old_word = ATM_LOAD (&mu->word);
			add_to_acquire = l_type->add_to_acquire;
			if (((old_word-l_type->add_to_acquire)&MU_ANY_LOCK) == 0 && had_waiters) {
				add_to_acquire = 0; /* release happens in nsync_mu_unlock_slow_ */
			}
		} while (!ATM_CAS_REL (&mu->word, old_word,
				       (old_word - add_to_acquire) & ~MU_SPINLOCK));
		if (add_to_acquire == 0) {
			/* The lock will be fully released, there are waiters, and
			   no designated waker, so wake waiters. */
			nsync_mu_unlock_slow_ (mu, l_type);
		}

		/* wait until awoken or a timeout. */
		sem_outcome = 0;
		attempts = 0;
		have_lock = 0;
		while (ATM_LOAD_ACQ (&w->nw.waiting) != 0) { /* acquire load */
			if (sem_outcome == 0) {
				sem_outcome = nsync_sem_wait_with_cancel_ (w, abs_deadline,
									   cancel_note);
				if (sem_outcome != 0 && ATM_LOAD (&w->nw.waiting) != 0) {
					/* A timeout or cancellation occurred, and no wakeup.
					   Acquire the spinlock and mu, and confirm. */
					have_lock = mu_try_acquire_after_timeout_or_cancel (
						mu, l_type, w, remove_count);
					if (have_lock) { /* Successful acquire. */
						outcome = sem_outcome;
					}
				}
			}

			if (ATM_LOAD (&w->nw.waiting) != 0) {
				attempts = nsync_spin_delay_ (attempts); /* will ultimately yield */
			}
		}

		if (!have_lock) {
			/* If we didn't reacquire due to a cancellation/timeout, acquire now. */
			nsync_mu_lock_slow_ (mu, w, MU_DESIG_WAKER, l_type);
			RWLOCK_TRYACQUIRE (1, mu, l_type == nsync_writer_type_);
		}
		condition_is_true = (condition == NULL || (*condition) (condition_arg));
	}
	if (w != NULL) {
		nsync_waiter_free_ (w); /* free waiter if we allocated one. */
	}
	if (condition_is_true) {
		outcome = 0; /* condition is true trumps other outcomes. */
	}
	IGNORE_RACES_END ();
	return (outcome);
}